

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O2

bool __thiscall hwtest::pgraph::Register::scan_test(Register *this,int cnum,mt19937 *rnd)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  string name_;
  
  uVar2 = (*this->_vptr_Register[6])();
  (*this->_vptr_Register[7])(this,cnum,0xffffffffffffffff);
  uVar3 = (*this->_vptr_Register[6])(this,cnum);
  (*this->_vptr_Register[7])(this,cnum,0);
  uVar4 = (*this->_vptr_Register[6])(this,cnum);
  (*this->_vptr_Register[7])(this,cnum,(ulong)uVar2);
  (*this->_vptr_Register[2])(&name_,this);
  uVar2 = this->fixed;
  bVar1 = uVar3 != (this->mask | uVar2);
  if (uVar4 != uVar2 || bVar1) {
    printf("Bitscan mismatch for %s: is %08x/%08x, expected %08x/%08x\n",name_._M_dataplus._M_p,
           (ulong)uVar3,(ulong)uVar4);
  }
  std::__cxx11::string::~string((string *)&name_);
  return uVar4 != uVar2 || bVar1;
}

Assistant:

virtual bool scan_test(int cnum, std::mt19937 &rnd) {
		uint32_t tmp = read(cnum);
		write(cnum, 0xffffffff);
		uint32_t rall1 = read(cnum);
		write(cnum, 0);
		uint32_t rall0 = read(cnum);
		write(cnum, tmp);
		std::string name_ = name();
		if (rall1 != (mask | fixed) || rall0 != fixed) {
			printf("Bitscan mismatch for %s: is %08x/%08x, expected %08x/%08x\n", name_.c_str(), rall1, rall0, mask | fixed, fixed);
			return true;
		}
		return false;
	}